

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alist.c
# Opt level: O0

size_t expand_array_list(p_array_list alist)

{
  size_t sVar1;
  void **__s;
  void **array;
  size_t new_size;
  size_t size;
  p_array_list alist_local;
  
  sVar1 = alist->size;
  __s = (void **)malloc(sVar1 << 4);
  memset(__s,0,sVar1 << 4);
  memcpy(__s,alist->array,sVar1 << 3);
  free(alist->array);
  alist->array = __s;
  alist->size = sVar1 << 1;
  return sVar1 << 1;
}

Assistant:

size_t expand_array_list(p_array_list alist) {
    size_t size = alist->size;
    size_t new_size = size * 2;
    void** array = (void**)malloc(sizeof(void*) * new_size);
    memset(array, 0, sizeof(void*) * new_size);
    memcpy(array, alist->array, sizeof(void*) * size);
    free(alist->array);
    alist->array = array;
    alist->size = new_size;
    return new_size;
}